

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O3

void __thiscall string_view_find_first_of3_Test::TestBody(string_view_find_first_of3_Test *this)

{
  bool bVar1;
  int line;
  char *pcVar2;
  AssertionResult gtest_ar;
  string_view local_48;
  AssertHelper local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  uint local_1c;
  
  local_1c = 0;
  local_48.data_ = "0123abc";
  local_48.size_ = 7;
  local_38.data_ = (AssertHelperData *)wabt::string_view::find_first_of(&local_48,"0a",0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_30,"0U","string_view(\"0123abc\").find_first_of(\"0a\")",&local_1c,
             (unsigned_long *)&local_38);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x158;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1c = 0;
    local_48.data_ = "0123abc";
    local_48.size_ = 7;
    local_38.data_ = (AssertHelperData *)wabt::string_view::find_first_of(&local_48,"0a",0);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_30,"0U","string_view(\"0123abc\").find_first_of(\"0a\", 0)",&local_1c,
               (unsigned_long *)&local_38);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x159;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_1c = 4;
      local_48.data_ = "0123abc";
      local_48.size_ = 7;
      local_38.data_ = (AssertHelperData *)wabt::string_view::find_first_of(&local_48,"0a",1);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_30,"4U","string_view(\"0123abc\").find_first_of(\"0a\", 1)",&local_1c,
                 (unsigned_long *)&local_38);
      if (local_30[0] != (internal)0x0) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_48.data_ = "0123abc";
        local_48.size_ = 7;
        local_38.data_ = (AssertHelperData *)wabt::string_view::find_first_of(&local_48,"0a",5);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (local_30,"npos","string_view(\"0123abc\").find_first_of(\"0a\", 5)",
                   &(anonymous_namespace)::npos,(unsigned_long *)&local_38);
        if (local_30[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          if (local_28.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                     ,0x15b,pcVar2);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if ((((long *)local_48.data_ != (long *)0x0) &&
              (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
             ((long *)local_48.data_ != (long *)0x0)) {
            (**(code **)(*(long *)local_48.data_ + 8))();
          }
        }
        goto LAB_001f1d1b;
      }
      testing::Message::Message((Message *)&local_48);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x15a;
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
             ,line,pcVar2);
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((((long *)local_48.data_ != (long *)0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1))
     && ((long *)local_48.data_ != (long *)0x0)) {
    (**(code **)(*(long *)local_48.data_ + 8))();
  }
LAB_001f1d1b:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(string_view, find_first_of3) {
  ASSERT_EQ(0U, string_view("0123abc").find_first_of("0a"));
  ASSERT_EQ(0U, string_view("0123abc").find_first_of("0a", 0));
  ASSERT_EQ(4U, string_view("0123abc").find_first_of("0a", 1));
  ASSERT_EQ(npos, string_view("0123abc").find_first_of("0a", 5));
}